

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chset.hpp
# Opt level: O0

void __thiscall
boost::xpressive::detail::
compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>::
set_class(compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
          *this,char_class_type *m,bool no)

{
  byte in_DL;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_RSI;
  long in_RDI;
  undefined7 in_stack_ffffffffffffffe8;
  
  *(undefined1 *)(in_RDI + 0x21) = 1;
  if ((in_DL & 1) == 0) {
    *(ushort *)(in_RDI + 0x22) =
         *(ushort *)(in_RDI + 0x22) |
         *(ushort *)
          &(in_RSI->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
           super__Vector_impl_data._M_start;
  }
  else {
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
              (in_RSI,(value_type_conflict2 *)
                      (CONCAT17(in_DL,in_stack_ffffffffffffffe8) & 0x1ffffffffffffff));
  }
  return;
}

Assistant:

void set_class(char_class_type const &m, bool no)
    {
        this->has_posix_ = true;

        if(no)
        {
            this->posix_no_.push_back(m);
        }
        else
        {
            this->posix_yes_ |= m;
        }
    }